

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

string * vkt::SpirVAssembly::repeatString(string *__return_storage_ptr__,string *str,int times)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < times) {
    do {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)(str->_M_dataplus)._M_p)
      ;
      times = times + -1;
    } while (times != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

const string repeatString (const string& str, int times)
{
	string filler;
	for (int i = 0; i < times; ++i)
	{
		filler += str;
	}
	return filler;
}